

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_frame_codec.c
# Opt level: O0

AMQP_FRAME_CODEC_HANDLE
amqp_frame_codec_create
          (FRAME_CODEC_HANDLE frame_codec,AMQP_FRAME_RECEIVED_CALLBACK frame_received_callback,
          AMQP_EMPTY_FRAME_RECEIVED_CALLBACK empty_frame_received_callback,
          AMQP_FRAME_CODEC_ERROR_CALLBACK amqp_frame_codec_error_callback,void *callback_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQPVALUE_DECODER_HANDLE pAVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  AMQP_FRAME_CODEC_HANDLE result;
  void *callback_context_local;
  AMQP_FRAME_CODEC_ERROR_CALLBACK amqp_frame_codec_error_callback_local;
  AMQP_EMPTY_FRAME_RECEIVED_CALLBACK empty_frame_received_callback_local;
  AMQP_FRAME_RECEIVED_CALLBACK frame_received_callback_local;
  FRAME_CODEC_HANDLE frame_codec_local;
  
  if ((((frame_codec == (FRAME_CODEC_HANDLE)0x0) ||
       (frame_received_callback == (AMQP_FRAME_RECEIVED_CALLBACK)0x0)) ||
      (empty_frame_received_callback == (AMQP_EMPTY_FRAME_RECEIVED_CALLBACK)0x0)) ||
     (amqp_frame_codec_error_callback == (AMQP_FRAME_CODEC_ERROR_CALLBACK)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                ,"amqp_frame_codec_create",0x9a,1,
                "Bad arguments: frame_codec = %p, frame_received_callback = %p, empty_frame_received_callback = %p, amqp_frame_codec_error_callback = %p"
                ,frame_codec,frame_received_callback,empty_frame_received_callback,
                amqp_frame_codec_error_callback);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)calloc(1,0x40);
    if (l == (LOGGER_LOG)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                  ,"amqp_frame_codec_create",0xa3,1,"Could not allocate memory for AMQP frame codec"
                 );
      }
    }
    else {
      *(FRAME_CODEC_HANDLE *)l = frame_codec;
      *(AMQP_FRAME_RECEIVED_CALLBACK *)(l + 8) = frame_received_callback;
      *(AMQP_EMPTY_FRAME_RECEIVED_CALLBACK *)(l + 0x10) = empty_frame_received_callback;
      *(AMQP_FRAME_CODEC_ERROR_CALLBACK *)(l + 0x18) = amqp_frame_codec_error_callback;
      *(void **)(l + 0x20) = callback_context;
      *(undefined4 *)(l + 0x30) = 0;
      pAVar3 = amqpvalue_decoder_create(amqp_value_decoded,l);
      *(AMQPVALUE_DECODER_HANDLE *)(l + 0x28) = pAVar3;
      if (*(long *)(l + 0x28) == 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                    ,"amqp_frame_codec_create",0xb3,1,"Could not create AMQP decoder");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        iVar1 = frame_codec_subscribe(frame_codec,'\0',frame_received,l);
        if (iVar1 != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                      ,"amqp_frame_codec_create",0xbd,1,
                      "Could not subscribe for received AMQP frames");
          }
          amqpvalue_decoder_destroy(*(AMQPVALUE_DECODER_HANDLE *)(l + 0x28));
          free(l);
          l = (LOGGER_LOG)0x0;
        }
      }
    }
  }
  return (AMQP_FRAME_CODEC_HANDLE)l;
}

Assistant:

AMQP_FRAME_CODEC_HANDLE amqp_frame_codec_create(FRAME_CODEC_HANDLE frame_codec, AMQP_FRAME_RECEIVED_CALLBACK frame_received_callback,
    AMQP_EMPTY_FRAME_RECEIVED_CALLBACK empty_frame_received_callback, AMQP_FRAME_CODEC_ERROR_CALLBACK amqp_frame_codec_error_callback, void* callback_context)
{
    AMQP_FRAME_CODEC_HANDLE result;

    /* Codes_SRS_AMQP_FRAME_CODEC_01_012: [If any of the arguments frame_codec, frame_received_callback, amqp_frame_codec_error_callback or empty_frame_received_callback is NULL, amqp_frame_codec_create shall return NULL.] */
    if ((frame_codec == NULL) ||
        (frame_received_callback == NULL) ||
        (empty_frame_received_callback == NULL) ||
        (amqp_frame_codec_error_callback == NULL))
    {
        LogError("Bad arguments: frame_codec = %p, frame_received_callback = %p, empty_frame_received_callback = %p, amqp_frame_codec_error_callback = %p",
            frame_codec, frame_received_callback, empty_frame_received_callback, amqp_frame_codec_error_callback);
        result = NULL;
    }
    else
    {
        result = (AMQP_FRAME_CODEC_HANDLE)calloc(1, sizeof(AMQP_FRAME_CODEC));
        /* Codes_SRS_AMQP_FRAME_CODEC_01_020: [If allocating memory for the new amqp_frame_codec fails, then amqp_frame_codec_create shall fail and return NULL.] */
        if (result == NULL)
        {
            LogError("Could not allocate memory for AMQP frame codec");
        }
        else
        {
            result->frame_codec = frame_codec;
            result->frame_received_callback = frame_received_callback;
            result->empty_frame_received_callback = empty_frame_received_callback;
            result->error_callback = amqp_frame_codec_error_callback;
            result->callback_context = callback_context;
            result->decode_state = AMQP_FRAME_DECODE_FRAME;

            /* Codes_SRS_AMQP_FRAME_CODEC_01_018: [amqp_frame_codec_create shall create a decoder to be used for decoding AMQP values.] */
            result->decoder = amqpvalue_decoder_create(amqp_value_decoded, result);
            if (result->decoder == NULL)
            {
                /* Codes_SRS_AMQP_FRAME_CODEC_01_019: [If creating the decoder fails, amqp_frame_codec_create shall fail and return NULL.] */
                LogError("Could not create AMQP decoder");
                free(result);
                result = NULL;
            }
            else
            {
                /* Codes_SRS_AMQP_FRAME_CODEC_01_013: [amqp_frame_codec_create shall subscribe for AMQP frames with the given frame_codec.] */
                if (frame_codec_subscribe(frame_codec, FRAME_TYPE_AMQP, frame_received, result) != 0)
                {
                    /* Codes_SRS_AMQP_FRAME_CODEC_01_014: [If subscribing for AMQP frames fails, amqp_frame_codec_create shall fail and return NULL.] */
                    LogError("Could not subscribe for received AMQP frames");
                    amqpvalue_decoder_destroy(result->decoder);
                    free(result);
                    result = NULL;
                }
            }
        }
    }

    return result;
}